

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O1

bool __thiscall ELFIO::elfio::load(elfio *this,string *file_name,bool is_lazy)

{
  basic_ifstream<char,_std::char_traits<char>_> *pbVar1;
  istream *stream;
  bool bVar2;
  basic_ifstream<char,_std::char_traits<char>_> *this_00;
  
  this_00 = (basic_ifstream<char,_std::char_traits<char>_> *)operator_new(0x208);
  std::ifstream::ifstream(this_00);
  pbVar1 = (this->pstream)._M_t.
           super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
           .super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>.
           _M_head_impl;
  (this->pstream)._M_t.
  super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       this_00;
  if (pbVar1 != (basic_ifstream<char,_std::char_traits<char>_> *)0x0) {
    (**(code **)(*(long *)pbVar1 + 8))();
  }
  pbVar1 = (this->pstream)._M_t.
           super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
           .super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>.
           _M_head_impl;
  if (pbVar1 != (basic_ifstream<char,_std::char_traits<char>_> *)0x0) {
    std::ifstream::open((char *)pbVar1,(_Ios_Openmode)(file_name->_M_dataplus)._M_p);
    stream = (istream *)
             (this->pstream)._M_t.
             super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl;
    if (((byte)(stream + 0x20)[*(long *)(*(long *)stream + -0x18)] & 5) == 0) {
      bVar2 = load(this,stream,is_lazy);
      if (is_lazy) {
        return bVar2;
      }
      pbVar1 = (this->pstream)._M_t.
               super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
               .super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>.
               _M_head_impl;
      (this->pstream)._M_t.
      super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl = (basic_ifstream<char,_std::char_traits<char>_> *)0x0;
      if (pbVar1 == (basic_ifstream<char,_std::char_traits<char>_> *)0x0) {
        return bVar2;
      }
      (**(code **)(*(long *)pbVar1 + 8))();
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool load( const std::string& file_name, bool is_lazy = false )
    {
        pstream = std::make_unique<std::ifstream>();
        if ( !pstream ) {
            return false;
        }

        pstream->open( file_name.c_str(), std::ios::in | std::ios::binary );
        if ( !*pstream ) {
            return false;
        }

        bool ret = load( *pstream, is_lazy );

        if ( !is_lazy ) {
            pstream.reset();
        }

        return ret;
    }